

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::DrawMesh(DeviceContextGLImpl *this,DrawMeshAttribs *Attribs)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  DrawMeshAttribs *Attribs_local;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._8_8_ = Attribs;
  FormatString<char[36]>((string *)local_38,(char (*) [36])"DrawMesh is not supported in OpenGL");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"DrawMesh",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
             ,0x537);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void DeviceContextGLImpl::DrawMesh(const DrawMeshAttribs& Attribs)
{
    UNSUPPORTED("DrawMesh is not supported in OpenGL");
}